

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

Test * testing::internal::
       HandleSehExceptionsInMethodIfSupported<testing::internal::TestFactoryBase,testing::Test*>
                 (TestFactoryBase *object,offset_in_TestFactoryBase_to_subr method,char *location)

{
  Test *pTVar1;
  code *local_50;
  char *location_local;
  offset_in_TestFactoryBase_to_subr method_local;
  TestFactoryBase *object_local;
  
  local_50 = (code *)method;
  if ((method & 1) != 0) {
    local_50 = *(code **)(*(long *)(location + (long)&object->_vptr_TestFactoryBase) + (method - 1))
    ;
  }
  pTVar1 = (Test *)(*local_50)(location + (long)&object->_vptr_TestFactoryBase);
  return pTVar1;
}

Assistant:

Result HandleSehExceptionsInMethodIfSupported(
    T* object, Result (T::*method)(), const char* location) {
#if GTEST_HAS_SEH
  __try {
    return (object->*method)();
  } __except (internal::UnitTestOptions::GTestShouldProcessSEH(  // NOLINT
      GetExceptionCode())) {
    // We create the exception message on the heap because VC++ prohibits
    // creation of objects with destructors on stack in functions using __try
    // (see error C2712).
    internal::String* exception_message = FormatSehExceptionMessage(
        GetExceptionCode(), location);
    internal::ReportFailureInUnknownLocation(TestPartResult::kFatalFailure,
                                             *exception_message);
    delete exception_message;
    return static_cast<Result>(0);
  }
#else
  (void)location;
  return (object->*method)();
#endif  // GTEST_HAS_SEH
}